

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O2

void string_contains_stl_string_pointer(void)

{
  string *this;
  Constraint *constraint;
  allocator local_11;
  
  this = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this,"obbo",&local_11);
  bob_pointer_abi_cxx11_ = this;
  constraint = (Constraint *)cgreen::create_contains_string_constraint((string *)this,"bob_pointer")
  ;
  cgreen::assert_that_<char_const*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x52,"\"bobbob\"","bobbob",constraint);
  return;
}

Assistant:

Ensure(string_contains_stl_string_pointer) {
    bob_pointer = new std::string("obbo");
    assert_that("bobbob", contains_string(bob_pointer));
}